

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void libtorrent::aux::apply_deprecated_dht_settings
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                *sett,bdecode_node *s)

{
  undefined8 uVar1;
  bool bVar2;
  int64_t iVar3;
  string_view local_608;
  bdecode_node local_5f8;
  string_view local_5b8;
  bdecode_node local_5a8;
  string_view local_568;
  bdecode_node local_558;
  string_view local_518;
  bdecode_node local_508;
  string_view local_4c8;
  bdecode_node local_4b8;
  string_view local_478;
  bdecode_node local_468;
  string_view local_428;
  bdecode_node local_418;
  string_view local_3d8;
  bdecode_node local_3c8;
  string_view local_388;
  bdecode_node local_378;
  string_view local_338;
  bdecode_node local_328;
  string_view local_2e8;
  bdecode_node local_2d8;
  string_view local_298;
  bdecode_node local_288;
  string_view local_248;
  bdecode_node local_238;
  string_view local_1f8;
  bdecode_node local_1e8;
  string_view local_1a8;
  bdecode_node local_198;
  string_view local_158;
  bdecode_node local_148;
  string_view local_108;
  bdecode_node local_f8;
  string_view local_a8;
  bdecode_node local_98;
  undefined1 local_58 [8];
  bdecode_node val;
  bdecode_node *s_local;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *sett_local;
  
  val._56_8_ = s;
  bdecode_node::bdecode_node((bdecode_node *)local_58);
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,"max_peers_reply");
  bdecode_node::dict_find_int(&local_98,(bdecode_node *)uVar1,local_a8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_98);
  bdecode_node::~bdecode_node(&local_98);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4089,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_108,"search_branching");
  bdecode_node::dict_find_int(&local_f8,(bdecode_node *)uVar1,local_108);
  bdecode_node::operator=((bdecode_node *)local_58,&local_f8);
  bdecode_node::~bdecode_node(&local_f8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408a,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,"max_fail_count");
  bdecode_node::dict_find_int(&local_148,(bdecode_node *)uVar1,local_158);
  bdecode_node::operator=((bdecode_node *)local_58,&local_148);
  bdecode_node::~bdecode_node(&local_148);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408b,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,"max_torrents");
  bdecode_node::dict_find_int(&local_198,(bdecode_node *)uVar1,local_1a8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_198);
  bdecode_node::~bdecode_node(&local_198);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408c,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,"max_dht_items");
  bdecode_node::dict_find_int(&local_1e8,(bdecode_node *)uVar1,local_1f8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_1e8);
  bdecode_node::~bdecode_node(&local_1e8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408d,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"max_peers")
  ;
  bdecode_node::dict_find_int(&local_238,(bdecode_node *)uVar1,local_248);
  bdecode_node::operator=((bdecode_node *)local_58,&local_238);
  bdecode_node::~bdecode_node(&local_238);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408e,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_298,"max_torrent_search_reply");
  bdecode_node::dict_find_int(&local_288,(bdecode_node *)uVar1,local_298);
  bdecode_node::operator=((bdecode_node *)local_58,&local_288);
  bdecode_node::~bdecode_node(&local_288);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x408f,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,"restrict_routing_ips");
  bdecode_node::dict_find_int(&local_2d8,(bdecode_node *)uVar1,local_2e8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_2d8);
  bdecode_node::~bdecode_node(&local_2d8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8046,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_338,"restrict_search_ips");
  bdecode_node::dict_find_int(&local_328,(bdecode_node *)uVar1,local_338);
  bdecode_node::operator=((bdecode_node *)local_58,&local_328);
  bdecode_node::~bdecode_node(&local_328);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8047,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_388,"extended_routing_table");
  bdecode_node::dict_find_int(&local_378,(bdecode_node *)uVar1,local_388);
  bdecode_node::operator=((bdecode_node *)local_58,&local_378);
  bdecode_node::~bdecode_node(&local_378);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8048,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d8,"aggressive_lookups");
  bdecode_node::dict_find_int(&local_3c8,(bdecode_node *)uVar1,local_3d8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_3c8);
  bdecode_node::~bdecode_node(&local_3c8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x8049,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,"privacy_lookups");
  bdecode_node::dict_find_int(&local_418,(bdecode_node *)uVar1,local_428);
  bdecode_node::operator=((bdecode_node *)local_58,&local_418);
  bdecode_node::~bdecode_node(&local_418);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804a,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_478,"enforce_node_id");
  bdecode_node::dict_find_int(&local_468,(bdecode_node *)uVar1,local_478);
  bdecode_node::operator=((bdecode_node *)local_58,&local_468);
  bdecode_node::~bdecode_node(&local_468);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804b,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4c8,"ignore_dark_internet");
  bdecode_node::dict_find_int(&local_4b8,(bdecode_node *)uVar1,local_4c8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_4b8);
  bdecode_node::~bdecode_node(&local_4b8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804c,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_518,"block_timeout");
  bdecode_node::dict_find_int(&local_508,(bdecode_node *)uVar1,local_518);
  bdecode_node::operator=((bdecode_node *)local_58,&local_508);
  bdecode_node::~bdecode_node(&local_508);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4090,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_568,"block_ratelimit");
  bdecode_node::dict_find_int(&local_558,(bdecode_node *)uVar1,local_568);
  bdecode_node::operator=((bdecode_node *)local_58,&local_558);
  bdecode_node::~bdecode_node(&local_558);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4091,(int)iVar3);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5b8,"read_only")
  ;
  bdecode_node::dict_find_int(&local_5a8,(bdecode_node *)uVar1,local_5b8);
  bdecode_node::operator=((bdecode_node *)local_58,&local_5a8);
  bdecode_node::~bdecode_node(&local_5a8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_bool((settings_pack *)sett,0x804d,iVar3 != 0);
  }
  uVar1 = val._56_8_;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_608,"item_lifetime");
  bdecode_node::dict_find_int(&local_5f8,(bdecode_node *)uVar1,local_608);
  bdecode_node::operator=((bdecode_node *)local_58,&local_5f8);
  bdecode_node::~bdecode_node(&local_5f8);
  bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar2) {
    iVar3 = bdecode_node::int_value((bdecode_node *)local_58);
    settings_pack::set_int((settings_pack *)sett,0x4092,(int)iVar3);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_58);
  return;
}

Assistant:

void apply_deprecated_dht_settings(settings_pack& sett, bdecode_node const& s)
{
	bdecode_node val;
	val = s.dict_find_int("max_peers_reply");
	if (val) sett.set_int(settings_pack::dht_max_peers_reply, int(val.int_value()));
	val = s.dict_find_int("search_branching");
	if (val) sett.set_int(settings_pack::dht_search_branching, int(val.int_value()));
	val = s.dict_find_int("max_fail_count");
	if (val) sett.set_int(settings_pack::dht_max_fail_count, int(val.int_value()));
	val = s.dict_find_int("max_torrents");
	if (val) sett.set_int(settings_pack::dht_max_torrents, int(val.int_value()));
	val = s.dict_find_int("max_dht_items");
	if (val) sett.set_int(settings_pack::dht_max_dht_items, int(val.int_value()));
	val = s.dict_find_int("max_peers");
	if (val) sett.set_int(settings_pack::dht_max_peers, int(val.int_value()));
	val = s.dict_find_int("max_torrent_search_reply");
	if (val) sett.set_int(settings_pack::dht_max_torrent_search_reply, int(val.int_value()));
	val = s.dict_find_int("restrict_routing_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_routing_ips, (val.int_value() != 0));
	val = s.dict_find_int("restrict_search_ips");
	if (val) sett.set_bool(settings_pack::dht_restrict_search_ips, (val.int_value() != 0));
	val = s.dict_find_int("extended_routing_table");
	if (val) sett.set_bool(settings_pack::dht_extended_routing_table, (val.int_value() != 0));
	val = s.dict_find_int("aggressive_lookups");
	if (val) sett.set_bool(settings_pack::dht_aggressive_lookups, (val.int_value() != 0));
	val = s.dict_find_int("privacy_lookups");
	if (val) sett.set_bool(settings_pack::dht_privacy_lookups, (val.int_value() != 0));
	val = s.dict_find_int("enforce_node_id");
	if (val) sett.set_bool(settings_pack::dht_enforce_node_id, (val.int_value() != 0));
	val = s.dict_find_int("ignore_dark_internet");
	if (val) sett.set_bool(settings_pack::dht_ignore_dark_internet, (val.int_value() != 0));
	val = s.dict_find_int("block_timeout");
	if (val) sett.set_int(settings_pack::dht_block_timeout, int(val.int_value()));
	val = s.dict_find_int("block_ratelimit");
	if (val) sett.set_int(settings_pack::dht_block_ratelimit, int(val.int_value()));
	val = s.dict_find_int("read_only");
	if (val) sett.set_bool(settings_pack::dht_read_only, (val.int_value() != 0));
	val = s.dict_find_int("item_lifetime");
	if (val) sett.set_int(settings_pack::dht_item_lifetime, int(val.int_value()));
}